

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

Var Js::TypedArrayBase::EntryJoin(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  CallFlags e;
  BOOL BVar4;
  charcount_t cVar5;
  ScriptContext *pSVar6;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar7;
  Var pvVar8;
  undefined4 extraout_var;
  uint *puVar9;
  CallInfo this_00;
  undefined4 extraout_var_00;
  JavascriptString *pJVar10;
  undefined4 extraout_var_01;
  int local_b0;
  uint local_94;
  uint32 i;
  JavascriptString *element;
  CompoundString *cs;
  CharCount local_78;
  byte local_71;
  charcount_t estimatedAppendSize;
  bool hasSeparator;
  JavascriptString *separator;
  JavascriptLibrary *library;
  TypedArrayBase *pTStack_58;
  uint32 length;
  TypedArrayBase *typedArrayBase;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar6 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar6);
  pSVar6 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar6,(PVOID)0x0);
  iVar3 = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,iVar3);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x7a6,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  typedArrayBase = (TypedArrayBase *)RecyclableObject::GetScriptContext(function);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x7a9,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pTStack_58 = ValidateTypedArray((Arguments *)&scriptContext,(ScriptContext *)typedArrayBase,
                                  L"[TypedArray].prototype.join");
  library._4_4_ = ArrayObject::GetLength((ArrayObject *)pTStack_58);
  separator = (JavascriptString *)ScriptContext::GetLibrary((ScriptContext *)typedArrayBase);
  _estimatedAppendSize = (JavascriptString *)0x0;
  if (((uint)scriptContext & 0xffffff) != 1 && ((ulong)scriptContext & 0xffffff) != 0) {
    pvVar8 = Arguments::operator[]((Arguments *)&scriptContext,1);
    BVar4 = Js::JavascriptOperators::IsUndefined(pvVar8);
    if (BVar4 == 0) {
      pvVar8 = Arguments::operator[]((Arguments *)&scriptContext,1);
      _estimatedAppendSize = JavascriptConversion::ToString(pvVar8,(ScriptContext *)typedArrayBase);
      goto LAB_01392b24;
    }
  }
  _estimatedAppendSize = JavascriptLibrary::GetCommaDisplayString((JavascriptLibrary *)separator);
LAB_01392b24:
  if (library._4_4_ == 0) {
    callInfo_local = (CallInfo)JavascriptLibrary::GetEmptyString((JavascriptLibrary *)separator);
  }
  else if (library._4_4_ == 1) {
    iVar3 = (*(pTStack_58->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pTStack_58,0);
    callInfo_local =
         (CallInfo)
         JavascriptConversion::ToString
                   ((Var)CONCAT44(extraout_var,iVar3),(ScriptContext *)typedArrayBase);
  }
  else {
    cVar5 = JavascriptString::GetLength(_estimatedAppendSize);
    local_71 = cVar5 != 0;
    cs._4_4_ = 0x800000;
    if ((bool)local_71) {
      local_b0 = library._4_4_ - 1;
    }
    else {
      local_b0 = 0;
    }
    cs._0_4_ = library._4_4_ + local_b0;
    puVar9 = min<unsigned_int>((uint *)((long)&cs + 4),(uint *)&cs);
    local_78 = *puVar9;
    this_00 = (CallInfo)
              CompoundString::NewWithPointerCapacity(local_78,(JavascriptLibrary *)separator);
    if (library._4_4_ < 2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                  ,0x7cc,"(length >= 2)","length >= 2");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    iVar3 = (*(pTStack_58->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pTStack_58,0);
    pJVar10 = JavascriptConversion::ToString
                        ((Var)CONCAT44(extraout_var_00,iVar3),(ScriptContext *)typedArrayBase);
    CompoundString::Append((CompoundString *)this_00,pJVar10);
    for (local_94 = 1; callInfo_local = this_00, local_94 < library._4_4_; local_94 = local_94 + 1)
    {
      if ((local_71 & 1) != 0) {
        CompoundString::Append((CompoundString *)this_00,_estimatedAppendSize);
      }
      iVar3 = (*(pTStack_58->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x72])(pTStack_58,(ulong)local_94);
      pJVar10 = JavascriptConversion::ToString
                          ((Var)CONCAT44(extraout_var_01,iVar3),(ScriptContext *)typedArrayBase);
      CompoundString::Append((CompoundString *)this_00,pJVar10);
    }
  }
  return (Var)callInfo_local;
}

Assistant:

Var TypedArrayBase::EntryJoin(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));
        CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(TypedArray_Prototype_join);

        TypedArrayBase* typedArrayBase = ValidateTypedArray(args, scriptContext, _u("[TypedArray].prototype.join"));
        uint32 length = typedArrayBase->GetLength();

        JavascriptLibrary* library = scriptContext->GetLibrary();
        JavascriptString* separator = nullptr;

        if (args.Info.Count > 1 && !JavascriptOperators::IsUndefined(args[1]))
        {
            separator = JavascriptConversion::ToString(args[1], scriptContext);
        }
        else
        {
            separator = library->GetCommaDisplayString();
        }

        if (length == 0)
        {
            return library->GetEmptyString();
        }
        else if (length == 1)
        {
            return JavascriptConversion::ToString(typedArrayBase->DirectGetItem(0), scriptContext);
        }

        bool hasSeparator = (separator->GetLength() != 0);

        charcount_t estimatedAppendSize = min(
            static_cast<charcount_t>((64 << 20) / sizeof(void *)), // 64 MB worth of pointers
            static_cast<charcount_t>(length + (hasSeparator ? length - 1 : 0)));

        CompoundString* const cs = CompoundString::NewWithPointerCapacity(estimatedAppendSize, library);

        Assert(length >= 2);

        JavascriptString* element = JavascriptConversion::ToString(typedArrayBase->DirectGetItem(0), scriptContext);

        cs->Append(element);

        for (uint32 i = 1; i < length; i++)
        {
            if (hasSeparator)
            {
                cs->Append(separator);
            }

            // Since i < length, we can be certain that the TypedArray contains an item at index i and we don't have to check for undefined
            element = JavascriptConversion::ToString(typedArrayBase->DirectGetItem(i), scriptContext);

            cs->Append(element);
        }

        return cs;
    }